

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltc.cpp
# Opt level: O1

void __thiscall ltc::set_ltc_parameters(ltc *this,vec3 *parameters)

{
  float fVar1;
  anon_union_12_3_e2189aaa_for_vec<3,_float,_(glm::precision)0>_3 local_28;
  undefined4 uStack_1c;
  ulong local_18;
  ulong uStack_10;
  undefined4 local_8;
  
  local_28.field_0.x = (parameters->field_0).field_0.x;
  fVar1 = (parameters->field_0).field_0.y;
  if (local_28.field_0.x <= 1e-07) {
    local_28.field_0.x = 1e-07;
  }
  if (fVar1 <= 1e-07) {
    fVar1 = 1e-07;
  }
  local_28.field_0.y = 0.0;
  local_28.field_0.z = 0.0;
  uStack_1c = 0;
  local_18 = (ulong)(uint)fVar1;
  uStack_10 = (ulong)(uint)(parameters->field_0).field_0.z;
  local_8 = 0x3f800000;
  set_ltc_matrix(this,(mat3 *)&local_28.field_0);
  return;
}

Assistant:

void ltc::set_ltc_parameters(const glm::vec3 &parameters)
{
  // Safeguard against really low parameters which will result in irreversible ltc matrix.
  float a = std::max(1e-7f, parameters.x);
  float b = std::max(1e-7f, parameters.y);
  float c = parameters.z;

  set_ltc_matrix({
    {a,    0.0f, 0.0f},
    {0.0f, b,    0.0f},
    {c,    0.0f, 1.0f}
  });
}